

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *in_RSI;
  lua_State *in_RDI;
  char *chunkname;
  int status;
  FileReaderCtx ctx;
  char *local_2050;
  FILE *local_2040;
  char *in_stack_ffffffffffffe030;
  char *in_stack_ffffffffffffe038;
  void *in_stack_ffffffffffffe040;
  lua_Reader in_stack_ffffffffffffe048;
  lua_State *in_stack_ffffffffffffe050;
  int local_1c;
  
  if (in_RSI == (char *)0x0) {
    local_2040 = _stdin;
    local_2050 = "=stdin";
  }
  else {
    local_2040 = fopen64(in_RSI,"rb");
    if (local_2040 == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      lua_pushfstring(in_RDI,"cannot open %s: %s",in_RSI,pcVar3);
      return 6;
    }
    local_2050 = lua_pushfstring(in_RDI,"@%s",in_RSI);
  }
  local_1c = lua_loadx(in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,in_stack_ffffffffffffe040
                       ,in_stack_ffffffffffffe038,in_stack_ffffffffffffe030);
  iVar1 = ferror(local_2040);
  if (iVar1 == 0) {
    if (in_RSI != (char *)0x0) {
      in_RDI->top = in_RDI->top + -1;
      in_RDI->top[-1] = *in_RDI->top;
      fclose(local_2040);
    }
  }
  else {
    iVar1 = 1;
    if (in_RSI != (char *)0x0) {
      iVar1 = 2;
    }
    in_RDI->top = in_RDI->top + -(long)iVar1;
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    lua_pushfstring(in_RDI,"cannot read %s: %s",local_2050 + 1,pcVar3);
    if (in_RSI != (char *)0x0) {
      fclose(local_2040);
    }
    local_1c = 6;
  }
  return local_1c;
}

Assistant:

LUALIB_API int luaL_loadfilex(lua_State *L, const char *filename,
			      const char *mode)
{
  FileReaderCtx ctx;
  int status;
  const char *chunkname;
  if (filename) {
    ctx.fp = fopen(filename, "rb");
    if (ctx.fp == NULL) {
      lua_pushfstring(L, "cannot open %s: %s", filename, strerror(errno));
      return LUA_ERRFILE;
    }
    chunkname = lua_pushfstring(L, "@%s", filename);
  } else {
    ctx.fp = stdin;
    chunkname = "=stdin";
  }
  status = lua_loadx(L, reader_file, &ctx, chunkname, mode);
  if (ferror(ctx.fp)) {
    L->top -= filename ? 2 : 1;
    lua_pushfstring(L, "cannot read %s: %s", chunkname+1, strerror(errno));
    if (filename)
      fclose(ctx.fp);
    return LUA_ERRFILE;
  }
  if (filename) {
    L->top--;
    copyTV(L, L->top-1, L->top);
    fclose(ctx.fp);
  }
  return status;
}